

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
Add<Js::PropertyRecord_const*>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *this,
          PropertyRecord *propertyKey,PropertyAttributes attributes,bool isInitialized,bool isFixed,
          bool usedAsFixed,ScriptContext *scriptContext)

{
  unsigned_short propertyIndex;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (0xfffe < *(int *)(this + 0xc)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x3fa,"(this->GetSlotCapacity() <= MaxPropertyIndexSize)",
                                "this->GetSlotCapacity() <= MaxPropertyIndexSize");
    if (!bVar2) goto LAB_00e31fcd;
    *puVar3 = 0;
  }
  if (*(int *)(this + 0xc) <= (int)(uint)*(ushort *)(this + 0x2a)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x3fb,"(nextPropertyIndex < this->GetSlotCapacity())",
                                "nextPropertyIndex < this->GetSlotCapacity()");
    if (!bVar2) {
LAB_00e31fcd:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  propertyIndex = *(unsigned_short *)(this + 0x2a);
  if (propertyIndex != 0xffff) {
    *(unsigned_short *)(this + 0x2a) = propertyIndex + 1;
    Add<Js::PropertyRecord_const*>
              (this,propertyIndex,propertyKey,attributes,isInitialized,isFixed,usedAsFixed,
               scriptContext);
    return;
  }
  ::Math::DefaultOverflowPolicy();
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Add(
        TPropertyKey propertyKey,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        Assert(this->GetSlotCapacity() <= MaxPropertyIndexSize);   // slotCapacity should never exceed MaxPropertyIndexSize
        Assert(nextPropertyIndex < this->GetSlotCapacity());       // nextPropertyIndex must be ready

        Add(::Math::PostInc(nextPropertyIndex), propertyKey, attributes, isInitialized, isFixed, usedAsFixed, scriptContext);
    }